

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_dbp_encoder.hpp
# Opt level: O1

void __thiscall duckdb::DbpEncoder::WriteBlock(DbpEncoder *this,WriteStream *writer)

{
  data_t *__s;
  byte bVar1;
  bool bVar2;
  int64_t *piVar3;
  long lVar4;
  ulong uVar5;
  bitpacking_width_t *pbVar6;
  long lVar7;
  int64_t iVar8;
  bitpacking_width_t bVar9;
  ulong uVar10;
  ulong uVar11;
  byte local_61;
  DbpEncoder *local_60;
  bitpacking_width_t *local_58;
  WriteStream *local_50;
  ulong local_48;
  ulong local_40;
  int64_t *local_38;
  
  uVar10 = this->block_count + 0xff;
  local_48 = uVar10 >> 8;
  if (0xff < uVar10) {
    piVar3 = this->data;
    lVar4 = 0;
    uVar5 = 0;
    do {
      lVar7 = 0;
      do {
        if ((ulong)(lVar4 + lVar7) < this->block_count) {
          iVar8 = piVar3[lVar7] - this->min_delta;
        }
        else {
          iVar8 = 0;
        }
        piVar3[lVar7] = iVar8;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x100);
      uVar5 = uVar5 + 1;
      piVar3 = piVar3 + 0x100;
      lVar4 = lVar4 + 0x100;
    } while (uVar5 != local_48);
  }
  piVar3 = this->data + 1;
  uVar5 = 0;
  do {
    if (uVar5 < local_48) {
      uVar11 = this->data[uVar5 * 0x100];
      lVar4 = 0;
      do {
        if (uVar11 < (ulong)piVar3[lVar4]) {
          uVar11 = piVar3[lVar4];
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0xff);
      lVar4 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      bVar9 = '@' - ((byte)lVar4 ^ 0x3f);
      if (uVar11 >> 0x38 != 0) {
        bVar9 = '@';
      }
      if (uVar11 == 0) {
        bVar9 = '\0';
      }
    }
    else {
      bVar9 = '\0';
    }
    this->list_of_bitwidths_of_miniblocks[uVar5] = bVar9;
    uVar5 = uVar5 + 1;
    piVar3 = piVar3 + 0x100;
  } while (uVar5 != 8);
  uVar5 = this->min_delta >> 0x3f ^ this->min_delta * 2;
  do {
    local_61 = (0x7f < uVar5) << 7 | (byte)uVar5 & 0x7f;
    (**writer->_vptr_WriteStream)(writer,&local_61,1);
    bVar2 = 0x7f < uVar5;
    uVar5 = uVar5 >> 7;
  } while (bVar2);
  pbVar6 = this->list_of_bitwidths_of_miniblocks;
  local_60 = this;
  (**writer->_vptr_WriteStream)(writer,pbVar6,8);
  if (0xff < uVar10) {
    piVar3 = local_60->data;
    __s = local_60->data_packed;
    uVar10 = 0;
    local_58 = pbVar6;
    local_50 = writer;
    do {
      switchD_01306cb1::default(__s,0,0x800);
      bVar1 = pbVar6[uVar10];
      uVar11 = 0xffffffffffffffe0;
      uVar5 = 0;
      local_40 = uVar10;
      local_38 = piVar3;
      do {
        duckdb_fastpforlib::fastpack
                  ((uint64_t *)piVar3,(uint32_t *)(__s + (uVar5 >> 3)),(uint)bVar1);
        uVar10 = local_40;
        pbVar6 = local_58;
        uVar11 = uVar11 + 0x20;
        piVar3 = piVar3 + 0x20;
        uVar5 = uVar5 + (ulong)bVar1 * 0x20;
      } while (uVar11 < 0xe0);
      (**local_50->_vptr_WriteStream)(local_50,__s,(ulong)local_58[local_40] << 5);
      uVar10 = uVar10 + 1;
      piVar3 = local_38 + 0x100;
    } while (uVar10 != local_48);
  }
  local_60->count = local_60->count + local_60->block_count;
  local_60->min_delta = 0x7fffffffffffffff;
  local_60->block_count = 0;
  return;
}

Assistant:

void WriteBlock(WriteStream &writer) {
		D_ASSERT(count + block_count == total_value_count || block_count == BLOCK_SIZE_IN_VALUES);
		const auto number_of_miniblocks =
		    (block_count + NUMBER_OF_VALUES_IN_A_MINIBLOCK - 1) / NUMBER_OF_VALUES_IN_A_MINIBLOCK;
		for (idx_t miniblock_idx = 0; miniblock_idx < number_of_miniblocks; miniblock_idx++) {
			for (idx_t i = 0; i < NUMBER_OF_VALUES_IN_A_MINIBLOCK; i++) {
				const idx_t index = miniblock_idx * NUMBER_OF_VALUES_IN_A_MINIBLOCK + i;
				auto &value = data[index];
				if (index < block_count) {
					// 2. Compute the frame of reference (the minimum of the deltas in the block).
					// Subtract this min delta from all deltas in the block.
					// This guarantees that all values are non-negative.
					D_ASSERT(min_delta <= value);
					value = static_cast<int64_t>(static_cast<uint64_t>(value) - static_cast<uint64_t>(min_delta));
				} else {
					// If there are not enough values to fill the last miniblock, we pad the miniblock
					// so that its length is always the number of values in a full miniblock multiplied by the bit
					// width. The values of the padding bits should be zero, but readers must accept paddings consisting
					// of arbitrary bits as well.
					value = 0;
				}
			}
		}

		for (idx_t miniblock_idx = 0; miniblock_idx < NUMBER_OF_MINIBLOCKS_IN_A_BLOCK; miniblock_idx++) {
			auto &width = list_of_bitwidths_of_miniblocks[miniblock_idx];
			if (miniblock_idx < number_of_miniblocks) {
				const auto src = &data[miniblock_idx * NUMBER_OF_VALUES_IN_A_MINIBLOCK];
				width = BitpackingPrimitives::MinimumBitWidth(reinterpret_cast<uint64_t *>(src),
				                                              NUMBER_OF_VALUES_IN_A_MINIBLOCK);
				D_ASSERT(width <= sizeof(int64_t) * 8);
			} else {
				// If, in the last block, less than <number of miniblocks in a block> miniblocks are needed to store the
				// values, the bytes storing the bit widths of the unneeded miniblocks are still present, their value
				// should be zero, but readers must accept arbitrary values as well. There are no additional padding
				// bytes for the miniblock bodies though, as if their bit widths were 0 (regardless of the actual byte
				// values). The reader knows when to stop reading by keeping track of the number of values read.
				width = 0;
			}
		}

		// 3. Encode the frame of reference (min delta) as a zigzag ULEB128 int
		// followed by the bit widths of the miniblocks
		// and the delta values (minus the min delta) bit-packed per miniblock.
		// <min delta> <list of bitwidths of miniblocks> <miniblocks>

		// the min delta is a zigzag ULEB128 int (we compute a minimum as we need positive integers for bit packing)
		ParquetDecodeUtils::VarintEncode(ParquetDecodeUtils::IntToZigzag(min_delta), writer);
		// the bitwidth of each block is stored as a byte
		writer.WriteData(list_of_bitwidths_of_miniblocks, NUMBER_OF_MINIBLOCKS_IN_A_BLOCK);
		// each miniblock is a list of bit packed ints according to the bit width stored at the beginning of the block
		for (idx_t miniblock_idx = 0; miniblock_idx < number_of_miniblocks; miniblock_idx++) {
			const auto src = &data[miniblock_idx * NUMBER_OF_VALUES_IN_A_MINIBLOCK];
			const auto &width = list_of_bitwidths_of_miniblocks[miniblock_idx];
			memset(data_packed, 0, sizeof(data_packed));
			ParquetDecodeUtils::BitPackAligned(reinterpret_cast<uint64_t *>(src), data_packed,
			                                   NUMBER_OF_VALUES_IN_A_MINIBLOCK, width);
			const auto write_size = NUMBER_OF_VALUES_IN_A_MINIBLOCK * width / 8;
#ifdef DEBUG
			// immediately verify that unpacking yields the input data
			int64_t verification_data[NUMBER_OF_VALUES_IN_A_MINIBLOCK];
			ByteBuffer byte_buffer(data_ptr_cast(data_packed), write_size);
			bitpacking_width_t bitpack_pos = 0;
			ParquetDecodeUtils::BitUnpack(byte_buffer, bitpack_pos, verification_data, NUMBER_OF_VALUES_IN_A_MINIBLOCK,
			                              width);
			for (idx_t i = 0; i < NUMBER_OF_VALUES_IN_A_MINIBLOCK; i++) {
				D_ASSERT(src[i] == verification_data[i]);
			}
#endif
			writer.WriteData(data_packed, write_size);
		}

		count += block_count;

		min_delta = NumericLimits<int64_t>::Maximum();
		block_count = 0;
	}